

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineShape.h
# Opt level: O2

void __thiscall chrono::ChLineShape::~ChLineShape(ChLineShape *this)

{
  (this->super_ChVisualShape)._vptr_ChVisualShape = (_func_int **)&PTR__ChLineShape_0118dd90;
  std::__cxx11::string::~string((string *)&this->name);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->gline).super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  ChVisualShape::~ChVisualShape(&this->super_ChVisualShape);
  return;
}

Assistant:

virtual ~ChLineShape() {}